

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *vec)

{
  uint *puVar1;
  int iVar2;
  type_conflict5 tVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  uVar5 = (ulong)(uint)this->thedim;
  while (0 < (int)uVar5) {
    uVar5 = uVar5 - 1;
    lVar7 = (long)(this->l).rorig[uVar5];
    local_a8.data._M_elems._32_8_ = *(undefined8 *)(vec[lVar7].m_backend.data._M_elems + 8);
    local_a8.data._M_elems._0_8_ = *(undefined8 *)vec[lVar7].m_backend.data._M_elems;
    local_a8.data._M_elems._8_8_ = *(undefined8 *)(vec[lVar7].m_backend.data._M_elems + 2);
    puVar1 = vec[lVar7].m_backend.data._M_elems + 4;
    local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_a8.exp = vec[lVar7].m_backend.exp;
    local_a8.neg = vec[lVar7].m_backend.neg;
    local_a8.fpclass = vec[lVar7].m_backend.fpclass;
    local_a8.prec_elem = vec[lVar7].m_backend.prec_elem;
    local_68.data._M_elems[0] = 0;
    local_68.data._M_elems[1] = 0;
    tVar3 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_a8,(double *)&local_68);
    if (tVar3) {
      piVar4 = (this->l).rbeg;
      lVar6 = (long)piVar4[lVar7];
      lVar8 = lVar6 * 0x38;
      for (; lVar6 < piVar4[lVar7 + 1]; lVar6 = lVar6 + 1) {
        iVar2 = (this->l).ridx[lVar6];
        local_68.fpclass = cpp_dec_float_finite;
        local_68.prec_elem = 10;
        local_68.data._M_elems[0] = 0;
        local_68.data._M_elems[1] = 0;
        local_68.data._M_elems[2] = 0;
        local_68.data._M_elems[3] = 0;
        local_68.data._M_elems[4] = 0;
        local_68.data._M_elems[5] = 0;
        local_68.data._M_elems._24_5_ = 0;
        local_68.data._M_elems[7]._1_3_ = 0;
        local_68.data._M_elems._32_5_ = 0;
        local_68._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_68,&local_a8,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)(((this->l).rval.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar8));
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&vec[iVar2].m_backend,&local_68);
        piVar4 = (this->l).rbeg;
        lVar8 = lVar8 + 0x38;
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLleft(R* vec) const
{

#ifndef SOPLEX_WITH_L_ROWS
   int*  idx;
   R* val;
   R* lval  = l.val.data();
   int*  lidx  = l.idx;
   int*  lrow  = l.row;
   int*  lbeg  = l.start;

   for(int i = l.firstUpdate - 1; i >= 0; --i)
   {
      int k = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x = 0;

      for(int j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }

#else

   for(int i = thedim - 1; i >= 0; --i)
   {
      int  r = l.rorig[i];
      R x = vec[r];

      if(x != 0.0)
      {
         for(int k = l.rbeg[r]; k < l.rbeg[r + 1]; k++)
         {
            int j = l.ridx[k];

            assert(l.rperm[j] < i);

            vec[j] -= x * l.rval[k];
         }
      }
   }

#endif // SOPLEX_WITH_L_ROWS
}